

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

size_t __thiscall
kj::_::Delimited<kj::ArrayPtr<const_kj::HttpByteRange>_>::size
          (Delimited<kj::ArrayPtr<const_kj::HttpByteRange>_> *this)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  long lVar5;
  long lVar6;
  long lVar4;
  
  ensureStringifiedInitialized(this);
  sVar1 = (this->stringified).size_;
  if (sVar1 == 0) {
    sVar3 = 0;
  }
  else {
    lVar5 = 0;
    sVar3 = 0;
    lVar6 = 0;
    do {
      lVar2 = *(long *)((long)&(((this->stringified).ptr)->content).size_ + lVar5);
      lVar4 = 0;
      if (lVar2 != 0) {
        lVar4 = lVar2 + -1;
      }
      sVar3 = lVar4 + sVar3 + lVar6;
      lVar5 = lVar5 + 0x18;
      lVar6 = (this->delimiter).content.size_ - 1;
    } while (sVar1 * 0x18 != lVar5);
  }
  return sVar3;
}

Assistant:

size_t size() {
    ensureStringifiedInitialized();

    size_t result = 0;
    bool first = true;
    for (auto& e: stringified) {
      if (first) {
        first = false;
      } else {
        result += delimiter.size();
      }
      result += e.size();
    }
    return result;
  }